

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder-helper.c
# Opt level: O0

uint8_t * tlv_get_type_length(uint8_t *buf,size_t buflen,uint32_t *type,uint32_t *length)

{
  size_t sVar1;
  size_t sVar2;
  uint8_t *ptr;
  uint32_t siz;
  uint32_t *length_local;
  uint32_t *type_local;
  size_t buflen_local;
  uint8_t *buf_local;
  
  sVar1 = tlv_get_tlvar(buf,buflen,type);
  if ((int)sVar1 == 0) {
    buf_local = (uint8_t *)0x0;
  }
  else {
    sVar2 = tlv_get_tlvar(buf + (sVar1 & 0xffffffff),buflen - (sVar1 & 0xffffffff),length);
    buf_local = buf + (sVar1 & 0xffffffff) + (sVar2 & 0xffffffff);
    if ((int)sVar2 == 0) {
      buf_local = (uint8_t *)0x0;
    }
  }
  return buf_local;
}

Assistant:

uint8_t*
tlv_get_type_length(uint8_t* buf, size_t buflen, uint32_t* type, uint32_t* length){
  uint32_t siz;
  uint8_t* ptr = buf;

  siz = tlv_get_tlvar(ptr, buflen, type);
  ptr += siz;
  buflen -= siz;
  if(siz == 0){
    return NULL;
  }

  siz = tlv_get_tlvar(ptr, buflen, length);
  ptr += siz;
  buflen -= siz;
  if(siz == 0){
    return NULL;
  }

  return ptr;
}